

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

bool __thiscall
vkb::PhysicalDevice::enable_features_node_if_present
          (PhysicalDevice *this,GenericFeaturesPNextNode *node)

{
  bool bVar1;
  undefined8 *puVar2;
  GenericFeatureChain requested_features;
  GenericFeatureChain fill_chain;
  VkPhysicalDeviceFeatures2 actual_pdf2;
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_138;
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_118;
  VkPhysicalDeviceFeatures2 local_100;
  
  memset(&local_100,0,0xf0);
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::push_back((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               *)&local_138,node);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::vector((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            *)&local_118,
           (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            *)&local_138);
  detail::GenericFeaturesPNextNode::disable_fields
            (local_118._M_impl.super__Vector_impl_data._M_start);
  local_100.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
  detail::GenericFeatureChain::chain_up((GenericFeatureChain *)&local_118,&local_100);
  if (this->instance_version < 0x401000) {
    if (this->properties2_ext_enabled != false) {
      puVar2 = (undefined8 *)(detail::vulkan_functions()::v + 0x90);
      goto LAB_001089cb;
    }
  }
  else {
    puVar2 = (undefined8 *)(detail::vulkan_functions()::v + 0x88);
LAB_001089cb:
    (*(code *)*puVar2)(this->physical_device,&local_100);
    bVar1 = detail::GenericFeatureChain::match_all
                      ((GenericFeatureChain *)&local_118,(GenericFeatureChain *)&local_138);
    if (bVar1) {
      detail::GenericFeatureChain::combine
                (&this->extended_features_chain,(GenericFeatureChain *)&local_138);
      bVar1 = true;
      goto LAB_001089ff;
    }
  }
  bVar1 = false;
LAB_001089ff:
  std::
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::~_Vector_base(&local_118);
  std::
  _Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::~_Vector_base(&local_138);
  return bVar1;
}

Assistant:

bool PhysicalDevice::enable_features_node_if_present(detail::GenericFeaturesPNextNode const& node) {
    VkPhysicalDeviceFeatures2 actual_pdf2{};

    detail::GenericFeatureChain requested_features;
    requested_features.nodes.push_back(node);

    detail::GenericFeatureChain fill_chain = requested_features;
    // Zero out supported features
    fill_chain.nodes.front().disable_fields();

    actual_pdf2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    fill_chain.chain_up(actual_pdf2);

    bool required_features_supported = false;
    bool instance_is_1_1 = instance_version >= VKB_VK_API_VERSION_1_1;
    if (instance_is_1_1 || properties2_ext_enabled) {
        if (instance_is_1_1) {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2(physical_device, &actual_pdf2);
        } else {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2KHR(physical_device, &actual_pdf2);
        }
        required_features_supported = fill_chain.match_all(requested_features);
        if (required_features_supported) {
            extended_features_chain.combine(requested_features);
        }
    }
    return required_features_supported;
}